

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateInlineMethods
          (MessageGenerator *this,Printer *p)

{
  Descriptor *desc;
  initializer_list<google::protobuf::io::Printer::Sub> v_00;
  undefined1 desc_00 [8];
  undefined8 uVar1;
  bool bVar2;
  AlphaNum *pAVar3;
  int __c;
  char *pcVar4;
  undefined1 cap_next_letter;
  char *in_R8;
  Iterator IVar5;
  string_view sVar6;
  string_view input;
  Sub *local_7c0;
  basic_string_view<char,_std::char_traits<char>_> local_6e8;
  undefined1 local_6d1;
  int local_6d0;
  allocator<char> local_6c9;
  string local_6c8;
  AlphaNum local_6a8;
  string_view local_678;
  string local_668;
  AlphaNum local_648;
  string local_618;
  allocator<char> local_5f1;
  string local_5f0;
  _Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic> local_5c8;
  AnnotationRecord local_5c0;
  AlphaNum local_580;
  AlphaNum *local_550;
  char *local_548;
  AlphaNum local_540;
  string local_510;
  allocator<char> local_4e9;
  string local_4e8;
  Sub local_4c8;
  Sub *local_410;
  Sub local_408;
  Sub local_350;
  Sub local_298;
  iterator local_1e0;
  size_type local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_1d0;
  undefined1 local_1c0 [8];
  value_type oneof;
  Iterator __end3;
  Iterator __begin3;
  OneOfRangeImpl *__range3;
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
  local_180;
  Span<google::protobuf::io::Printer::Sub_const> local_168 [16];
  undefined1 local_158 [8];
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  t;
  Options local_130;
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
  local_58;
  Span<const_google::protobuf::io::Printer::Sub> local_40;
  undefined1 local_30 [8];
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  v;
  Printer *p_local;
  MessageGenerator *this_local;
  
  desc = this->descriptor_;
  v.storage_.callback_buffer_._8_8_ = p;
  cpp::Options::Options(&local_130,&this->options_);
  cpp::anon_unknown_0::ClassVars(&local_58,desc,&local_130);
  absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
  Span<std::vector<google::protobuf::io::Printer::Sub,std::allocator<google::protobuf::io::Printer::Sub>>,void,std::vector<google::protobuf::io::Printer::Sub,std::allocator<google::protobuf::io::Printer::Sub>>,int>
            ((Span<google::protobuf::io::Printer::Sub_const> *)&local_40,&local_58);
  io::Printer::WithVars
            ((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
              *)local_30,p,local_40);
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  ~vector(&local_58);
  cpp::Options::~Options(&local_130);
  uVar1 = v.storage_.callback_buffer_._8_8_;
  MakeTrackerCalls(&local_180,this->descriptor_,&this->options_);
  absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
  Span<std::vector<google::protobuf::io::Printer::Sub,std::allocator<google::protobuf::io::Printer::Sub>>,void,std::vector<google::protobuf::io::Printer::Sub,std::allocator<google::protobuf::io::Printer::Sub>>,int>
            (local_168,&local_180);
  io::Printer::WithVars
            ((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
              *)local_158,(Printer *)uVar1,(Span<const_google::protobuf::io::Printer::Sub>)local_168
            );
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  ~vector(&local_180);
  bVar2 = IsMapEntryMessage(this->descriptor_);
  if (!bVar2) {
    GenerateFieldAccessorDefinitions(this,(Printer *)v.storage_.callback_buffer_._8_8_);
    __begin3.descriptor = (Descriptor *)OneOfRange(this->descriptor_);
    IVar5 = OneOfRangeImpl::begin((OneOfRangeImpl *)&__begin3.descriptor);
    __begin3._0_8_ = IVar5.descriptor;
    __end3.descriptor._0_4_ = IVar5.idx;
    IVar5 = OneOfRangeImpl::end((OneOfRangeImpl *)&__begin3.descriptor);
    __end3._0_8_ = IVar5.descriptor;
    oneof._0_4_ = IVar5.idx;
    while( true ) {
      cap_next_letter = SUB81(in_R8,0);
      bVar2 = cpp::operator!=((Iterator *)&__end3.descriptor,(Iterator *)&oneof);
      if (!bVar2) break;
      local_1c0 = (undefined1  [8])
                  OneOfRangeImpl::Iterator::operator*((Iterator *)&__end3.descriptor);
      uVar1 = v.storage_.callback_buffer_._8_8_;
      local_6d1 = 1;
      local_410 = &local_408;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_4e8,"oneof_name",&local_4e9);
      sVar6 = OneofDescriptor::name((OneofDescriptor *)local_1c0);
      local_548 = sVar6._M_str;
      pAVar3 = (AlphaNum *)sVar6._M_len;
      local_550 = pAVar3;
      absl::lts_20250127::AlphaNum::AlphaNum(&local_540,sVar6);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_580,"_case");
      absl::lts_20250127::StrCat_abi_cxx11_(&local_510,(lts_20250127 *)&local_540,&local_580,pAVar3)
      ;
      io::Printer::Sub::Sub<std::__cxx11::string>(&local_4c8,&local_4e8,&local_510);
      desc_00 = local_1c0;
      std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional
                ((optional<google::protobuf::io::AnnotationCollector::Semantic> *)&local_5c8);
      io::Printer::AnnotationRecord::AnnotationRecord<google::protobuf::OneofDescriptor,_0>
                (&local_5c0,(OneofDescriptor *)desc_00,
                 (optional<google::protobuf::io::AnnotationCollector::Semantic>)local_5c8);
      io::Printer::Sub::AnnotatedAs(&local_408,&local_4c8,&local_5c0);
      local_410 = &local_350;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_5f0,"OneofName",&local_5f1);
      sVar6 = OneofDescriptor::name((OneofDescriptor *)local_1c0);
      input._M_len = sVar6._M_str;
      input._M_str = (char *)0x1;
      pAVar3 = (AlphaNum *)0x1;
      local_678 = sVar6;
      UnderscoresToCamelCase_abi_cxx11_(&local_668,(cpp *)sVar6._M_len,input,(bool)cap_next_letter);
      absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_648,&local_668);
      absl::lts_20250127::AlphaNum::AlphaNum(&local_6a8,"Case");
      absl::lts_20250127::StrCat_abi_cxx11_(&local_618,(lts_20250127 *)&local_648,&local_6a8,pAVar3)
      ;
      io::Printer::Sub::Sub<std::__cxx11::string>(&local_350,&local_5f0,&local_618);
      local_410 = &local_298;
      std::allocator<char>::allocator();
      pcVar4 = "oneof_index";
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_6c8,"oneof_index",&local_6c9);
      pcVar4 = OneofDescriptor::index((OneofDescriptor *)local_1c0,pcVar4,__c);
      local_6d0 = (int)pcVar4;
      io::Printer::Sub::Sub<int>(&local_298,&local_6c8,&local_6d0);
      local_6d1 = 0;
      local_1e0 = &local_408;
      local_1d8 = 3;
      v_00._M_len = 3;
      v_00._M_array = local_1e0;
      absl::lts_20250127::Span<google::protobuf::io::Printer::Sub_const>::
      Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
                ((Span<google::protobuf::io::Printer::Sub_const> *)local_1d0._M_local_buf,v_00);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_6e8,
                 "\n          inline $classname$::$OneofName$ $classname$::$oneof_name$() const {\n            return $classname$::$OneofName$($oneof_case$[$oneof_index$]);\n          }\n        "
                );
      io::Printer::SourceLocation::current();
      in_R8 = local_6e8._M_str;
      io::Printer::Emit((Printer *)uVar1,local_1d0._M_allocated_capacity,local_1d0._8_8_,
                        local_6e8._M_len);
      local_7c0 = (Sub *)&local_1e0;
      do {
        local_7c0 = local_7c0 + -1;
        io::Printer::Sub::~Sub(local_7c0);
      } while (local_7c0 != &local_408);
      std::__cxx11::string::~string((string *)&local_6c8);
      std::allocator<char>::~allocator(&local_6c9);
      std::__cxx11::string::~string((string *)&local_618);
      std::__cxx11::string::~string((string *)&local_668);
      std::__cxx11::string::~string((string *)&local_5f0);
      std::allocator<char>::~allocator(&local_5f1);
      io::Printer::AnnotationRecord::~AnnotationRecord(&local_5c0);
      io::Printer::Sub::~Sub(&local_4c8);
      std::__cxx11::string::~string((string *)&local_510);
      std::__cxx11::string::~string((string *)&local_4e8);
      std::allocator<char>::~allocator(&local_4e9);
      OneOfRangeImpl::Iterator::operator++((Iterator *)&__end3.descriptor);
    }
  }
  absl::lts_20250127::
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
  ::~Cleanup((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
              *)local_158);
  absl::lts_20250127::
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
  ::~Cleanup((Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
              *)local_30);
  return;
}

Assistant:

void MessageGenerator::GenerateInlineMethods(io::Printer* p) {
  auto v = p->WithVars(ClassVars(descriptor_, options_));
  auto t = p->WithVars(MakeTrackerCalls(descriptor_, options_));
  if (IsMapEntryMessage(descriptor_)) return;
  GenerateFieldAccessorDefinitions(p);

  // Generate oneof_case() functions.
  for (auto oneof : OneOfRange(descriptor_)) {
    p->Emit(
        {
            Sub{"oneof_name", absl::StrCat(oneof->name(), "_case")}.AnnotatedAs(
                oneof),
            {"OneofName",
             absl::StrCat(UnderscoresToCamelCase(oneof->name(), true), "Case")},
            {"oneof_index", oneof->index()},
        },
        R"cc(
          inline $classname$::$OneofName$ $classname$::$oneof_name$() const {
            return $classname$::$OneofName$($oneof_case$[$oneof_index$]);
          }
        )cc");
  }
}